

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O3

void __thiscall
kratos::BuiltInFunctionStmtBlock::BuiltInFunctionStmtBlock
          (BuiltInFunctionStmtBlock *this,Generator *parent,string *function_name)

{
  pointer pcVar1;
  UserException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  _Base_ptr local_e8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psStack_e0;
  char *local_d8;
  pointer pcStack_d0;
  string local_c8;
  undefined1 local_a8 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  functions;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> known_functions;
  
  pcVar1 = (function_name->_M_dataplus)._M_p;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar1,pcVar1 + function_name->_M_string_length);
  FunctionStmtBlock::FunctionStmtBlock(&this->super_FunctionStmtBlock,parent,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  (this->super_FunctionStmtBlock).super_StmtBlock.super_Stmt.super_IRNode._vptr_IRNode =
       (_func_int **)&PTR_accept_002a7328;
  get_builtin_function_info((optional<kratos::BuiltinFunctionInfo> *)local_a8,function_name);
  if (functions._M_t._M_impl.super__Rb_tree_header._M_header._4_1_ != '\0') {
    return;
  }
  get_builtin_function_names_abi_cxx11_();
  psStack_e0 = &functions;
  known_functions.field_2._8_8_ = &local_e8;
  local_e8 = functions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_d8 = "\n";
  pcStack_d0 = (pointer)0x1;
  format_str.size_ = 0xf;
  format_str.data_ = (char *)0x3;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)((long)&known_functions.field_2 + 8);
  fmt::v7::detail::vformat_abi_cxx11_
            ((string *)&functions._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (detail *)0x23d236,format_str,args);
  this_00 = (UserException *)__cxa_allocate_exception(0x10);
  local_e8 = (_Base_ptr)(function_name->_M_dataplus)._M_p;
  psStack_e0 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)function_name->_M_string_length;
  local_d8 = (char *)functions._M_t._M_impl.super__Rb_tree_header._M_node_count;
  pcStack_d0 = known_functions._M_dataplus._M_p;
  format_str_00.size_ = 0xdd;
  format_str_00.data_ = (char *)0x4f;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_e8;
  fmt::v7::detail::vformat_abi_cxx11_
            ((string *)((long)&known_functions.field_2 + 8),
             (detail *)
             "{0} is either not supported or not a system built-in. Supported methods are:{1}",
             format_str_00,args_00);
  UserException::UserException(this_00,(string *)((long)&known_functions.field_2 + 8));
  __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

BuiltInFunctionStmtBlock::BuiltInFunctionStmtBlock(Generator *parent,
                                                   const std::string &function_name)
    : FunctionStmtBlock(parent, function_name) {
    if (!get_builtin_function_info(function_name)) {
        auto functions = get_builtin_function_names();
        auto known_functions = ::format("{0}", fmt::join(functions.begin(), functions.end(), "\n"));
        throw UserException(::format(
            "{0} is either not supported or not a system built-in. Supported methods are:{1}",
            function_name, known_functions));
    }
}